

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O3

Polygon * __thiscall Polygon::ConvexHull(Polygon *__return_storage_ptr__,Polygon *this)

{
  size_t *psVar1;
  float fVar2;
  float fVar3;
  const_iterator __begin1;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  const_iterator __end1;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_28;
  float local_24;
  
  if ((this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node._M_size < 3) {
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node._M_size = 0;
  }
  else {
    p_Var4 = (this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node.
             super__List_node_base._M_next;
    fVar10 = *(float *)((long)(p_Var4 + 1) + 4);
    fVar3 = *(float *)(p_Var4 + 1);
    for (; p_Var4 != (_List_node_base *)this;
        p_Var4 = (((list<Point,_std::allocator<Point>_> *)&p_Var4->_M_next)->
                 super__List_base<Point,_std::allocator<Point>_>)._M_impl._M_node.
                 super__List_node_base._M_next) {
      fVar8 = *(float *)&((list<Point,_std::allocator<Point>_> *)(p_Var4 + 1))->
                         super__List_base<Point,_std::allocator<Point>_>;
      fVar11 = fVar8;
      if (fVar3 <= fVar8) {
        fVar11 = fVar3;
      }
      fVar10 = (float)(~-(uint)(fVar8 < fVar3) & (uint)fVar10 |
                      *(uint *)((long)(p_Var4 + 1) + 4) & -(uint)(fVar8 < fVar3));
      fVar3 = fVar11;
    }
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node._M_size = 0;
    local_28 = fVar3;
    local_24 = fVar10;
    do {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      *(float *)&p_Var4[1]._M_next = local_28;
      *(float *)((long)&p_Var4[1]._M_next + 4) = local_24;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var4 = (this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node.
               super__List_node_base._M_next;
      p_Var5 = p_Var4;
      if (p_Var4 == (_List_node_base *)this) {
        p_Var5 = p_Var4->_M_next;
        if (p_Var4->_M_next == (_List_node_base *)this) {
          p_Var5 = p_Var4;
        }
        fVar8 = *(float *)(p_Var5 + 1);
        fVar11 = *(float *)((long)(p_Var5 + 1) + 4);
      }
      else {
        do {
          if ((*(float *)&((list<Point,_std::allocator<Point>_> *)(p_Var5 + 1))->
                          super__List_base<Point,_std::allocator<Point>_> == local_28) &&
             (!NAN(*(float *)&((list<Point,_std::allocator<Point>_> *)(p_Var5 + 1))->
                              super__List_base<Point,_std::allocator<Point>_>) && !NAN(local_28))) {
            if ((*(float *)((long)(p_Var5 + 1) + 4) == local_24) &&
               (!NAN(*(float *)((long)(p_Var5 + 1) + 4)) && !NAN(local_24))) break;
          }
          p_Var5 = (((list<Point,_std::allocator<Point>_> *)&p_Var5->_M_next)->
                   super__List_base<Point,_std::allocator<Point>_>)._M_impl._M_node.
                   super__List_node_base._M_next;
        } while (p_Var5 != (_List_node_base *)this);
        p_Var5 = (((list<Point,_std::allocator<Point>_> *)&p_Var5->_M_next)->
                 super__List_base<Point,_std::allocator<Point>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
        if (p_Var5 == (_List_node_base *)this) {
          p_Var5 = p_Var4;
        }
        fVar11 = *(float *)((long)(p_Var5 + 1) + 4);
        fVar8 = *(float *)(p_Var5 + 1);
        for (; p_Var4 != (_List_node_base *)this; p_Var4 = p_Var4->_M_next) {
          fVar7 = *(float *)(p_Var4 + 1);
          fVar2 = *(float *)((long)(p_Var4 + 1) + 4);
          fVar9 = (fVar8 - fVar7) * (fVar2 - local_24) - (fVar11 - fVar2) * (fVar7 - local_28);
          if (0.0 <= fVar9) {
            fVar7 = fVar8;
          }
          uVar6 = -(uint)(fVar9 < 0.0);
          fVar11 = (float)(~uVar6 & (uint)fVar11 | (uint)fVar2 & uVar6);
          fVar8 = fVar7;
        }
      }
      local_28 = fVar8;
      local_24 = fVar11;
    } while ((((fVar8 != fVar3) || (NAN(fVar8) || NAN(fVar3))) || (fVar11 != fVar10)) ||
            (NAN(fVar11) || NAN(fVar10)));
  }
  return __return_storage_ptr__;
}

Assistant:

Polygon Polygon::ConvexHull() const
{
    // Gift-wrapping algorithm
    if(mPoints.size() < 3)
    {
        return Polygon();
    }
    Point leftmostPoint = mPoints.front();
    for(auto point : mPoints)
    {
        if(point.IsOnTheLeftOf(leftmostPoint))
        {
            leftmostPoint = point;
        }
    }
    Polygon convexHull;
    Point currentHullPoint = leftmostPoint;
    do
    {
        Point nextHullPoint;
        convexHull.mPoints.push_back(currentHullPoint);
        auto NextHullPointIt = std::find(mPoints.begin(), mPoints.end(), currentHullPoint);
        NextHullPointIt++;
        if(NextHullPointIt != mPoints.end())
        {
            nextHullPoint = *(NextHullPointIt);
        }
        else
        {
            nextHullPoint = mPoints.front();
        }
        for(auto candidateHullPoint : mPoints)
        {
            if(candidateHullPoint.IsOnTheLeftOf(currentHullPoint, nextHullPoint))
            {
                nextHullPoint = candidateHullPoint;
            }
        }
        currentHullPoint = nextHullPoint;
    } while(currentHullPoint != leftmostPoint);
    return convexHull;
}